

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_mktime_tzname.c
# Opt level: O3

time_t time2(tm *tmp,_func_tm_ptr_state_ptr_time_t_ptr_int_fast32_t_tm_ptr *funcp,state *sp,
            int_fast32_t offset,_Bool *okayp)

{
  time_t tVar1;
  
  tVar1 = time2sub(tmp,funcp,sp,offset,okayp,false);
  if (*okayp != false) {
    return tVar1;
  }
  tVar1 = time2sub(tmp,funcp,sp,offset,okayp,true);
  return tVar1;
}

Assistant:

static time_t time2( struct tm * tmp, struct tm *(*funcp)( struct state const *, time_t const *, int_fast32_t, struct tm * ), struct state const * sp, const int_fast32_t offset, bool * okayp )
{
    time_t t;

    /* First try without normalization of seconds
       (in case tm_sec contains a value associated with a leap second).
       If that fails, try with normalization of seconds.
    */
    t = time2sub( tmp, funcp, sp, offset, okayp, false );
    return *okayp ? t : time2sub( tmp, funcp, sp, offset, okayp, true );
}